

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O2

void If_LibBoxFree(If_LibBox_t *p)

{
  Vec_Ptr_t *p_00;
  If_Box_t *p_01;
  int i;
  
  if (p != (If_LibBox_t *)0x0) {
    for (i = 0; p_00 = p->vBoxes, i < p_00->nSize; i = i + 1) {
      p_01 = (If_Box_t *)Vec_PtrEntry(p_00,i);
      if (p_01 != (If_Box_t *)0x0) {
        If_BoxFree(p_01);
      }
    }
    free(p_00->pArray);
    free(p_00);
    free(p);
    return;
  }
  return;
}

Assistant:

void If_LibBoxFree( If_LibBox_t * p )
{
    If_Box_t * pBox;
    int i;
    if ( p == NULL )
        return;
    If_LibBoxForEachBox( p, pBox, i )
        If_BoxFree( pBox );
    Vec_PtrFree( p->vBoxes );
    ABC_FREE( p );
}